

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.hpp
# Opt level: O1

void __thiscall MODEL3D::three_dim_model::~three_dim_model(three_dim_model *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->cell_name)._M_dataplus._M_p;
  paVar1 = &(this->cell_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->py_script);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
  ::~_Rb_tree(&(this->etch_contour_map)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->layer_boundary_map)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_MODEL3D::Layer_prop>,_std::_Select1st<std::pair<const_int,_MODEL3D::Layer_prop>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
  ::~_Rb_tree(&(this->proc_info_map)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->clipper_polygons_map)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
               *)this);
  return;
}

Assistant:

~three_dim_model() {}